

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O3

HaI32 QuickSortVertices(HaF64 *vertList,HaI32 stride,HaI32 compareCount,HaI32 vertexCount,
                       HaF64 tolerance)

{
  long lVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 (*pauVar6) [16];
  bool bVar7;
  int iVar8;
  int iVar9;
  HaI32 HVar10;
  uint uVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int vertexCount_00;
  HaF64 *pHVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar33 [16];
  
  uVar24 = (ulong)(uint)stride;
  if (vertexCount < 0x18001) {
    HVar10 = SortVertices(vertList,stride,compareCount,vertexCount,tolerance);
    return HVar10;
  }
  lVar12 = (long)stride;
  auVar25 = ZEXT816(0) << 0x40;
  dVar28 = 0.0;
  auVar29 = ZEXT816(0) << 0x40;
  auVar27 = ZEXT864(0) << 0x40;
  lVar1 = lVar12 * 8;
  pauVar13 = (undefined1 (*) [16])(vertList + 3);
  uVar14 = (ulong)(uint)vertexCount;
  do {
    pauVar6 = pauVar13 + -1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(double *)(*pauVar6 + 8);
    auVar32 = *pauVar13;
    pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar1);
    uVar14 = uVar14 - 1;
    auVar29 = vfmadd231sd_fma(auVar29,auVar30,auVar30);
    auVar25 = vfmadd231pd_fma(auVar25,auVar32,auVar32);
    dVar28 = dVar28 + *(double *)(*pauVar6 + 8);
    auVar26._0_8_ = auVar27._0_8_ + auVar32._0_8_;
    auVar26._8_8_ = auVar27._8_8_ + auVar32._8_8_;
    auVar27 = ZEXT1664(auVar26);
  } while (uVar14 != 0);
  auVar31._0_8_ = (double)vertexCount;
  auVar31._8_8_ = in_XMM6_Qa;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar28 * dVar28;
  auVar32 = vfmsub213sd_fma(auVar29,auVar31,auVar32);
  auVar29._0_8_ = auVar26._0_8_ * auVar26._0_8_;
  auVar29._8_8_ = auVar26._8_8_ * auVar26._8_8_;
  auVar33._8_8_ = auVar31._0_8_;
  auVar33._0_8_ = auVar31._0_8_;
  auVar29 = vfmsub213pd_fma(auVar25,auVar33,auVar29);
  auVar25 = vshufpd_avx(auVar29,auVar29,1);
  uVar3 = vcmppd_avx512vl(auVar25,auVar29,1);
  uVar14 = vcmppd_avx512vl(auVar32,auVar29,1);
  uVar14 = ((byte)uVar3 & 3) & uVar14;
  bVar5 = (byte)uVar14;
  uVar3 = vcmppd_avx512vl(auVar32,auVar25,1);
  uVar4 = vcmppd_avx512vl(auVar29,auVar25,1);
  auVar25 = vshufpd_avx(auVar26,auVar26,1);
  bVar7 = (bool)((byte)uVar3 & 3 & (byte)uVar4 & 1);
  iVar8 = vertexCount + -1;
  uVar15 = 4;
  if (bVar7 == false) {
    uVar15 = (ulong)((uint)uVar14 & 1 | 2);
  }
  vertexCount_00 = 0;
  dVar28 = (double)((ulong)bVar7 * auVar25._0_8_ +
                   (ulong)!bVar7 *
                   ((ulong)(bVar5 & 1) * (long)auVar26._0_8_ +
                   (ulong)!(bool)(bVar5 & 1) * (long)dVar28)) / auVar31._0_8_;
  do {
    lVar19 = (long)vertexCount_00;
    lVar22 = lVar19 + -1;
    lVar20 = (lVar19 * 8 + 0x7fffffff8) * lVar12;
    pdVar16 = (double *)((long)vertList + lVar1 * lVar19 + uVar15 * 8);
    iVar21 = vertexCount_00;
    do {
      vertexCount_00 = iVar21;
      lVar22 = lVar22 + 1;
      iVar21 = vertexCount_00 + 1;
      lVar20 = lVar20 + uVar24 * 8;
      dVar2 = *pdVar16;
      pdVar16 = pdVar16 + lVar12;
    } while (dVar2 < dVar28);
    lVar17 = (long)iVar8;
    lVar19 = lVar17 + 1;
    lVar18 = (lVar17 * 8 + 8) * lVar12;
    pdVar16 = (double *)((long)vertList + lVar1 * lVar17 + uVar15 * 8);
    iVar9 = iVar8;
    do {
      iVar8 = iVar9;
      dVar2 = *pdVar16;
      lVar19 = lVar19 + -1;
      iVar9 = iVar8 + -1;
      pdVar16 = pdVar16 + -lVar12;
      lVar18 = lVar18 + uVar24 * -8;
    } while (dVar28 < dVar2);
    if ((lVar22 <= lVar19) && (iVar8 = iVar9, vertexCount_00 = iVar21, 0 < stride)) {
      uVar14 = 0;
      lVar22 = lVar18 * 0x20000000 >> 0x1d;
      lVar19 = lVar20 * 0x20000000 >> 0x1d;
      do {
        uVar3 = *(undefined8 *)((long)vertList + uVar14 * 8 + lVar19);
        *(undefined8 *)((long)vertList + uVar14 * 8 + lVar19) =
             *(undefined8 *)((long)vertList + uVar14 * 8 + lVar22);
        *(undefined8 *)((long)vertList + uVar14 * 8 + lVar22) = uVar3;
        uVar14 = uVar14 + 1;
      } while (uVar24 != uVar14);
    }
  } while (vertexCount_00 <= iVar8);
  if (vertexCount - vertexCount_00 == 0 || vertexCount < vertexCount_00) {
    __assert_fail("i0 < vertexCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x133,
                  "hacd::HaI32 QuickSortVertices(hacd::HaF64 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaF64)"
                 );
  }
  HVar10 = QuickSortVertices(vertList,stride,compareCount,vertexCount_00,tolerance);
  uVar11 = QuickSortVertices(vertList + vertexCount_00 * stride,stride,compareCount,
                             vertexCount - vertexCount_00,tolerance);
  lVar22 = (long)vertexCount_00;
  if (0 < (int)uVar11) {
    pHVar23 = vertList + 2;
    uVar24 = (ulong)uVar11;
    do {
      memcpy(pHVar23 + HVar10 * lVar12,(HaF64 *)((long)pHVar23 + lVar1 * lVar22),
             (ulong)(stride - 2) << 3);
      pHVar23 = pHVar23 + lVar12;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  pdVar16 = (double *)((long)vertList + lVar1 * lVar22);
  lVar22 = (ulong)(uint)vertexCount - lVar22;
  do {
    *pdVar16 = (double)HVar10 + *pdVar16;
    pdVar16 = pdVar16 + lVar12;
    lVar22 = lVar22 + -1;
  } while (lVar22 != 0);
  return uVar11 + HVar10;
}

Assistant:

static hacd::HaI32 QuickSortVertices (hacd::HaF64* const vertList, hacd::HaI32 stride, hacd::HaI32 compareCount, hacd::HaI32 vertexCount, hacd::HaF64 tolerance)
	{
		hacd::HaI32 count = 0;
		if (vertexCount > (3 * 1024 * 32)) {
		hacd::HaF64 x = hacd::HaF32 (0.0f);
		hacd::HaF64 y = hacd::HaF32 (0.0f);
		hacd::HaF64 z = hacd::HaF32 (0.0f);
		hacd::HaF64 xd = hacd::HaF32 (0.0f);
		hacd::HaF64 yd = hacd::HaF32 (0.0f);
		hacd::HaF64 zd = hacd::HaF32 (0.0f);
			
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF64 x0 = vertList[i * stride + 2];
			hacd::HaF64 y0 = vertList[i * stride + 3];
			hacd::HaF64 z0 = vertList[i * stride + 4];
				x += x0;
				y += y0;
				z += z0;
				xd += x0 * x0;
				yd += y0 * y0;
				zd += z0 * z0;
			}

			xd = vertexCount * xd - x * x;
			yd = vertexCount * yd - y * y;
			zd = vertexCount * zd - z * z;

			hacd::HaI32 axis = 2;
		        hacd::HaF64 axisVal = x / vertexCount;
			if ((yd > xd) && (yd > zd)) {
				axis = 3;
				axisVal = y / vertexCount;
			}
			if ((zd > xd) && (zd > yd)) {
				axis = 4;
				axisVal = z / vertexCount;
			}

			hacd::HaI32 i0 = 0;
			hacd::HaI32 i1 = vertexCount - 1;
			do {    
				for ( ;vertList[i0 * stride + axis] < axisVal; i0 ++); 
				for ( ;vertList[i1 * stride + axis] > axisVal; i1 --);
				if (i0 <= i1) {
					for (hacd::HaI32 i = 0; i < stride; i ++) {
						Swap (vertList[i0 * stride + i], vertList[i1 * stride + i]);
					}
					i0 ++; 
					i1 --;
				}
			} while (i0 <= i1);
			HACD_ASSERT (i0 < vertexCount);

		hacd::HaI32 count0 = QuickSortVertices (&vertList[ 0 * stride], stride, compareCount, i0, tolerance);
		hacd::HaI32 count1 = QuickSortVertices (&vertList[i0 * stride], stride, compareCount, vertexCount - i0, tolerance);
			
			count = count0 + count1;

			for (hacd::HaI32 i = 0; i < count1; i ++) {
			memcpy (&vertList[(count0 + i) * stride + 2], &vertList[(i0 + i) * stride + 2], (stride - 2) * sizeof (hacd::HaF64));
			}


//		hacd::HaF64* const indexPtr = (hacd::HaI64*)vertList;
			for (hacd::HaI32 i = i0; i < vertexCount; i ++) {
//			indexPtr[i * stride] += count0;
			vertList[i * stride] += hacd::HaF64 (count0);
			}

		} else {
		count = SortVertices (vertList, stride, compareCount, vertexCount, tolerance);
		}

		return count;
	}